

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O0

void Search::start(position *p,limits *lims,bool silent)

{
  int iVar1;
  bool bVar2;
  U16 UVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Move *pMVar7;
  reference pvVar8;
  pointer ppVar9;
  type ppVar10;
  U64 UVar11;
  size_type sVar12;
  ostream *poVar13;
  reference pvVar14;
  reference pvVar15;
  Move *m;
  Move *m_00;
  undefined2 local_5bc;
  string local_580;
  string local_560;
  unique_ptr<position,_std::default_delete<position>_> *local_540;
  unique_ptr<position,_std::default_delete<position>_> *t;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
  *__range1;
  undefined1 local_518 [4];
  Score max;
  Rootmoves bestRoots;
  U64 qnodes;
  U64 nodes;
  uint i_2;
  U16 depth;
  uint local_4dc;
  undefined1 local_4d8 [4];
  uint i_1;
  int local_4ac;
  undefined1 local_4a8 [4];
  int i;
  Movegen mvs;
  undefined1 local_120 [8];
  Threadpool<Workerthread> timer_thread;
  bool silent_local;
  limits *lims_local;
  position *p_local;
  
  timer_thread.num_threads._3_1_ = silent;
  std::
  vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
  ::clear(&mPositions);
  Threadpool<Workerthread>::Threadpool((Threadpool<Workerthread> *)local_120,1);
  elapsed = 0.0;
  UCI_SIGNALS.stop = false;
  position::set_nodes_searched(p,0);
  position::set_qnodes_searched(p,0);
  Movegen::Movegen((Movegen *)local_4a8,p);
  Movegen::generate<(Movetype)14,(Piece)6>((Movegen *)local_4a8);
  std::vector<Rootmove,_std::allocator<Rootmove>_>::clear(&p->root_moves);
  for (local_4ac = 0; iVar1 = local_4ac, iVar4 = Movegen::size((Movegen *)local_4a8), iVar1 < iVar4;
      local_4ac = local_4ac + 1) {
    pMVar7 = Movegen::operator[]((Movegen *)local_4a8,&local_4ac);
    bVar2 = position::is_legal(p,pMVar7);
    if (bVar2) {
      pMVar7 = Movegen::operator[]((Movegen *)local_4a8,&local_4ac);
      Rootmove::Rootmove((Rootmove *)local_4d8,pMVar7);
      std::vector<Rootmove,_std::allocator<Rootmove>_>::push_back
                (&p->root_moves,(value_type *)local_4d8);
      Rootmove::~Rootmove((Rootmove *)local_4d8);
    }
  }
  for (local_4dc = 0; uVar6 = local_4dc, uVar5 = Threadpool<Searchthread>::size(&SearchThreads),
      uVar6 < uVar5; local_4dc = local_4dc + 1) {
    std::make_unique<position,position&>((position *)&i_2);
    std::
    vector<std::unique_ptr<position,std::default_delete<position>>,std::allocator<std::unique_ptr<position,std::default_delete<position>>>>
    ::emplace_back<std::unique_ptr<position,std::default_delete<position>>>
              ((vector<std::unique_ptr<position,std::default_delete<position>>,std::allocator<std::unique_ptr<position,std::default_delete<position>>>>
                *)&mPositions,(unique_ptr<position,_std::default_delete<position>_> *)&i_2);
    std::unique_ptr<position,_std::default_delete<position>_>::~unique_ptr
              ((unique_ptr<position,_std::default_delete<position>_> *)&i_2);
    pvVar8 = std::
             vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
             ::operator[](&mPositions,(ulong)local_4dc);
    ppVar9 = std::unique_ptr<position,_std::default_delete<position>_>::operator->(pvVar8);
    position::set_id(ppVar9,(U16)local_4dc);
  }
  if (lims->depth == 0) {
    local_5bc = 0x40;
  }
  else {
    local_5bc = (undefined2)lims->depth;
  }
  nodes._6_2_ = local_5bc;
  std::atomic<bool>::operator=((atomic<bool> *)&searching,true);
  Threadpool<Workerthread>::enqueue<void(&)(position&,limits&),position&,limits&>
            ((Threadpool<Workerthread> *)local_120,search_timer,p,lims);
  uVar6 = Threadpool<Searchthread>::size(&SearchThreads);
  if (1 < uVar6) {
    for (nodes._0_4_ = 1; uVar6 = (uint)nodes,
        uVar5 = Threadpool<Searchthread>::size(&SearchThreads), uVar6 < uVar5;
        nodes._0_4_ = (uint)nodes + 1) {
      pvVar8 = std::
               vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
               ::operator[](&mPositions,(ulong)(uint)nodes);
      ppVar10 = std::unique_ptr<position,_std::default_delete<position>_>::operator*(pvVar8);
      Threadpool<Searchthread>::
      enqueue<void(&)(position&,unsigned_short,bool),position&,unsigned_short&,bool&>
                (&SearchThreads,iterative_deepening,ppVar10,(unsigned_short *)((long)&nodes + 6),
                 (bool *)((long)&timer_thread.num_threads + 3));
    }
  }
  pvVar8 = std::
           vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
           ::operator[](&mPositions,0);
  ppVar10 = std::unique_ptr<position,_std::default_delete<position>_>::operator*(pvVar8);
  Threadpool<Searchthread>::
  enqueue<void(&)(position&,unsigned_short,bool),position&,unsigned_short&,bool&>
            (&SearchThreads,iterative_deepening,ppVar10,(unsigned_short *)((long)&nodes + 6),
             (bool *)((long)&timer_thread.num_threads + 3));
  Threadpool<Searchthread>::wait_finished(&SearchThreads);
  UCI_SIGNALS.stop = true;
  bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Rootmove,_std::allocator<Rootmove>_>::vector
            ((vector<Rootmove,_std::allocator<Rootmove>_> *)local_518);
  __range1._4_4_ = ninf;
  __end1 = std::
           vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
           ::begin(&mPositions);
  t = (unique_ptr<position,_std::default_delete<position>_> *)
      std::
      vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
      ::end(&mPositions);
  while (bVar2 = __gnu_cxx::
                 operator==<std::unique_ptr<position,_std::default_delete<position>_>_*,_std::vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>_>
                           (&__end1,(__normal_iterator<std::unique_ptr<position,_std::default_delete<position>_>_*,_std::vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>_>
                                     *)&t), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_540 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<position,_std::default_delete<position>_>_*,_std::vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>_>
                ::operator*(&__end1);
    if ((timer_thread.num_threads._3_1_ & 1) == 0) {
      poVar13 = std::operator<<((ostream *)&std::cout,"id: ");
      ppVar9 = std::unique_ptr<position,_std::default_delete<position>_>::operator->(local_540);
      UVar3 = position::id(ppVar9);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,UVar3);
      poVar13 = std::operator<<(poVar13," ");
      ppVar9 = std::unique_ptr<position,_std::default_delete<position>_>::operator->(local_540);
      UVar11 = position::nodes(ppVar9);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,UVar11);
      poVar13 = std::operator<<(poVar13," ");
      ppVar9 = std::unique_ptr<position,_std::default_delete<position>_>::operator->(local_540);
      UVar11 = position::qnodes(ppVar9);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,UVar11);
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    ppVar9 = std::unique_ptr<position,_std::default_delete<position>_>::operator->(local_540);
    position::nodes(ppVar9);
    ppVar9 = std::unique_ptr<position,_std::default_delete<position>_>::operator->(local_540);
    UVar11 = position::qnodes(ppVar9);
    bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&((bestRoots.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage)->pv).
                          super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                          super__Vector_impl_data._M_start + UVar11);
    ppVar9 = std::unique_ptr<position,_std::default_delete<position>_>::operator->(local_540);
    sVar12 = std::vector<Rootmove,_std::allocator<Rootmove>_>::size(&ppVar9->root_moves);
    if (sVar12 != 0) {
      ppVar9 = std::unique_ptr<position,_std::default_delete<position>_>::operator->(local_540);
      pvVar14 = std::vector<Rootmove,_std::allocator<Rootmove>_>::operator[](&ppVar9->root_moves,0);
      if (__range1._4_4_ < pvVar14->score) {
        ppVar9 = std::unique_ptr<position,_std::default_delete<position>_>::operator->(local_540);
        pvVar14 = std::vector<Rootmove,_std::allocator<Rootmove>_>::operator[]
                            (&ppVar9->root_moves,0);
        __range1._4_4_ = pvVar14->score;
        ppVar9 = std::unique_ptr<position,_std::default_delete<position>_>::operator->(local_540);
        std::vector<Rootmove,_std::allocator<Rootmove>_>::operator=
                  ((vector<Rootmove,_std::allocator<Rootmove>_> *)local_518,&ppVar9->root_moves);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<position,_std::default_delete<position>_>_*,_std::vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>_>
    ::operator++(&__end1);
  }
  sVar12 = std::vector<Rootmove,_std::allocator<Rootmove>_>::size
                     ((vector<Rootmove,_std::allocator<Rootmove>_> *)local_518);
  if (sVar12 == 0) {
    pvVar8 = std::
             vector<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
             ::operator[](&mPositions,0);
    ppVar9 = std::unique_ptr<position,_std::default_delete<position>_>::operator->(pvVar8);
    std::vector<Rootmove,_std::allocator<Rootmove>_>::operator=
              ((vector<Rootmove,_std::allocator<Rootmove>_> *)local_518,&ppVar9->root_moves);
  }
  if ((timer_thread.num_threads._3_1_ & 1) == 0) {
    poVar13 = std::operator<<((ostream *)&std::cout,"bestmove ");
    pvVar14 = std::vector<Rootmove,_std::allocator<Rootmove>_>::operator[]
                        ((vector<Rootmove,_std::allocator<Rootmove>_> *)local_518,0);
    pvVar15 = std::vector<Move,_std::allocator<Move>_>::operator[](&pvVar14->pv,0);
    uci::move_to_string_abi_cxx11_(&local_560,(uci *)pvVar15,m);
    std::operator<<(poVar13,(string *)&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    pvVar14 = std::vector<Rootmove,_std::allocator<Rootmove>_>::operator[]
                        ((vector<Rootmove,_std::allocator<Rootmove>_> *)local_518,0);
    sVar12 = std::vector<Move,_std::allocator<Move>_>::size(&pvVar14->pv);
    if (1 < sVar12) {
      poVar13 = std::operator<<((ostream *)&std::cout," ponder ");
      pvVar14 = std::vector<Rootmove,_std::allocator<Rootmove>_>::operator[]
                          ((vector<Rootmove,_std::allocator<Rootmove>_> *)local_518,0);
      pvVar15 = std::vector<Move,_std::allocator<Move>_>::operator[](&pvVar14->pv,1);
      uci::move_to_string_abi_cxx11_(&local_580,(uci *)pvVar15,m_00);
      std::operator<<(poVar13,(string *)&local_580);
      std::__cxx11::string::~string((string *)&local_580);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::atomic<bool>::operator=((atomic<bool> *)&searching,false);
  if ((p->debug_search & 1U) != 0) {
    std::ofstream::close();
  }
  std::vector<Rootmove,_std::allocator<Rootmove>_>::~vector
            ((vector<Rootmove,_std::allocator<Rootmove>_> *)local_518);
  Movegen::~Movegen((Movegen *)local_4a8);
  Threadpool<Workerthread>::~Threadpool((Threadpool<Workerthread> *)local_120);
  return;
}

Assistant:

void Search::start(position& p, limits& lims, bool silent) {

	mPositions.clear();

	Threadpool<Workerthread> timer_thread(1);

	elapsed = 0;
	UCI_SIGNALS.stop = false;

	p.set_nodes_searched(0);
	p.set_qnodes_searched(0);

	// load the root moves
	Movegen mvs(p);
	mvs.generate<pseudo_legal, pieces>();
	p.root_moves.clear();
	for (int i = 0; i < mvs.size(); ++i) {
		if (!p.is_legal(mvs[i]))
			continue;
		p.root_moves.push_back(Rootmove(mvs[i]));
	}

	for (unsigned i = 0; i < SearchThreads.size(); ++i) {
		mPositions.emplace_back(std::make_unique<position>(p));
		mPositions[i]->set_id(i);
	}

	U16 depth = (lims.depth > 0 ? lims.depth : 64); // maxdepth
	searching = true;

	timer_thread.enqueue(search_timer, p, lims);


	// Launch worker threads
	if (SearchThreads.size() > 1) {
		for (unsigned i = 1; i < SearchThreads.size(); ++i)
			SearchThreads.enqueue(iterative_deepening, *mPositions[i], depth, silent);
	}

	// Launch main thread
	SearchThreads.enqueue(iterative_deepening, *mPositions[0], depth, silent);


	SearchThreads.wait_finished();
	UCI_SIGNALS.stop = true;


	U64 nodes = 0ULL;
	U64 qnodes = 0ULL;
	Rootmoves bestRoots;
	Score max = Score::ninf;
	for (auto& t : mPositions) {
		if (!silent) {
			std::cout << "id: " << t->id() << " " << t->nodes() << " " << t->qnodes() << std::endl;
		}
		nodes += t->nodes();
		qnodes += t->qnodes();

		if (t->root_moves.size() > 0 && t->root_moves[0].score > max) {
			max = t->root_moves[0].score;
			bestRoots = t->root_moves;
		}
	}

	if (bestRoots.size() <= 0)
		bestRoots = mPositions[0]->root_moves;

	if (!silent) {
		std::cout << "bestmove " << uci::move_to_string(bestRoots[0].pv[0]);
		if (bestRoots[0].pv.size() > 1)
			std::cout << " ponder " << uci::move_to_string(bestRoots[0].pv[1]);
		std::cout << std::endl;
	}

	searching = false;

	if (p.debug_search) {
		debug_file.close();
	}
}